

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_test.cpp
# Opt level: O3

void __thiscall RotateFromTo_Simple_Test::TestBody(RotateFromTo_Simple_Test *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  bool bVar10;
  char *pcVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  Vector3f to;
  AssertionResult gtest_ar;
  Transform r;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  AssertHelper local_d0;
  internal local_c8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  Tuple3<pbrt::Vector3,_float> local_b8;
  Tuple3<pbrt::Vector3,_float> local_a8;
  Transform local_98;
  
  local_a8.x = 0.0;
  local_a8.y = 0.0;
  local_a8.z = 1.0;
  pbrt::RotateFromTo(&local_98,(Vector3f)(ZEXT412(0x3f800000) << 0x40),
                     (Vector3f)(ZEXT412(0x3f800000) << 0x40));
  auVar1._4_4_ = local_98.m.m[0][2];
  auVar1._8_4_ = local_98.m.m[0][3];
  auVar1._0_4_ = local_98.m.m[0][1];
  auVar1._12_4_ = local_98.m.m[1][0];
  auVar2._4_4_ = local_98.m.m[0][1];
  auVar2._0_4_ = local_98.m.m[0][0];
  auVar2._8_4_ = local_98.m.m[0][2];
  auVar2._12_4_ = local_98.m.m[0][3];
  auVar7._8_4_ = local_98.m.m[1][0];
  auVar7._0_4_ = local_98.m.m[0][2];
  auVar7._4_4_ = local_98.m.m[0][3];
  auVar7._12_4_ = local_98.m.m[1][1];
  auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_98.m.m[1][1]),0x10);
  auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_98.m.m[1][0]),0x10);
  auVar15._0_4_ = auVar1._0_4_ * 0.0;
  auVar15._4_4_ = auVar1._4_4_ * 0.0;
  auVar15._8_4_ = auVar1._8_4_ * 0.0;
  auVar15._12_4_ = auVar1._12_4_ * 0.0;
  auVar2 = vfmadd213ps_fma(auVar2,ZEXT816(0) << 0x40,auVar15);
  auVar1 = vinsertps_avx(auVar7,ZEXT416((uint)local_98.m.m[1][2]),0x10);
  auVar12._0_4_ = auVar1._0_4_ + auVar2._0_4_;
  auVar12._4_4_ = auVar1._4_4_ + auVar2._4_4_;
  auVar12._8_4_ = auVar1._8_4_ + auVar2._8_4_;
  auVar12._12_4_ = auVar1._12_4_ + auVar2._12_4_;
  auVar1 = vfmadd231ss_fma(ZEXT416((uint)(local_98.m.m[2][1] * 0.0)),ZEXT816(0) << 0x20,
                           ZEXT416((uint)local_98.m.m[2][0]));
  local_b8._0_8_ = vmovlps_avx(auVar12);
  local_b8.z = auVar1._0_4_ + local_98.m.m[2][2];
  testing::internal::CmpHelperEQ<pbrt::Vector3<float>,pbrt::Vector3<float>>
            (local_c8,"to","toNew",(Vector3<float> *)&local_a8,(Vector3<float> *)&local_b8);
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d8);
    if (local_c0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = ((local_c0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/transform_test.cpp"
               ,0x50,pcVar11);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if (local_d8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar10 = testing::internal::IsTrue(true);
      if ((bVar10) &&
         (local_d8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_d8.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_a8._0_8_ = vmovlps_avx(SUB6416(ZEXT464(0x3f800000),0));
  local_a8.z = 0.0;
  to.super_Tuple3<pbrt::Vector3,_float>._0_8_ = SUB648(ZEXT464(0x3f800000),0);
  to.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
  pbrt::RotateFromTo(&local_98,(Vector3f)(ZEXT412(0x3f800000) << 0x40),to);
  auVar5._4_4_ = local_98.m.m[0][2];
  auVar5._8_4_ = local_98.m.m[0][3];
  auVar5._0_4_ = local_98.m.m[0][1];
  auVar5._12_4_ = local_98.m.m[1][0];
  auVar3._4_4_ = local_98.m.m[0][1];
  auVar3._0_4_ = local_98.m.m[0][0];
  auVar3._8_4_ = local_98.m.m[0][2];
  auVar3._12_4_ = local_98.m.m[0][3];
  auVar8._8_4_ = local_98.m.m[1][0];
  auVar8._0_4_ = local_98.m.m[0][2];
  auVar8._4_4_ = local_98.m.m[0][3];
  auVar8._12_4_ = local_98.m.m[1][1];
  auVar1 = vinsertps_avx(auVar5,ZEXT416((uint)local_98.m.m[1][1]),0x10);
  auVar2 = vinsertps_avx(auVar3,ZEXT416((uint)local_98.m.m[1][0]),0x10);
  auVar16._0_4_ = auVar1._0_4_ * 0.0;
  auVar16._4_4_ = auVar1._4_4_ * 0.0;
  auVar16._8_4_ = auVar1._8_4_ * 0.0;
  auVar16._12_4_ = auVar1._12_4_ * 0.0;
  auVar2 = vfmadd213ps_fma(auVar2,ZEXT816(0) << 0x40,auVar16);
  auVar1 = vinsertps_avx(auVar8,ZEXT416((uint)local_98.m.m[1][2]),0x10);
  auVar13._0_4_ = auVar1._0_4_ + auVar2._0_4_;
  auVar13._4_4_ = auVar1._4_4_ + auVar2._4_4_;
  auVar13._8_4_ = auVar1._8_4_ + auVar2._8_4_;
  auVar13._12_4_ = auVar1._12_4_ + auVar2._12_4_;
  auVar1 = vfmadd231ss_fma(ZEXT416((uint)(local_98.m.m[2][1] * 0.0)),ZEXT816(0) << 0x20,
                           ZEXT416((uint)local_98.m.m[2][0]));
  local_b8._0_8_ = vmovlps_avx(auVar13);
  local_b8.z = auVar1._0_4_ + local_98.m.m[2][2];
  testing::internal::CmpHelperEQ<pbrt::Vector3<float>,pbrt::Vector3<float>>
            (local_c8,"to","toNew",(Vector3<float> *)&local_a8,(Vector3<float> *)&local_b8);
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d8);
    if (local_c0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = ((local_c0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/transform_test.cpp"
               ,0x57,pcVar11);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if (local_d8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar10 = testing::internal::IsTrue(true);
      if ((bVar10) &&
         (local_d8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_d8.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_a8._0_8_ = vmovlps_avx(ZEXT816(0x3f80000000000000));
  local_a8.z = 0.0;
  pbrt::RotateFromTo(&local_98,(Vector3f)(ZEXT412(0x3f800000) << 0x40),
                     (Vector3f)ZEXT812(0x3f80000000000000));
  auVar6._4_4_ = local_98.m.m[0][2];
  auVar6._8_4_ = local_98.m.m[0][3];
  auVar6._0_4_ = local_98.m.m[0][1];
  auVar6._12_4_ = local_98.m.m[1][0];
  auVar4._4_4_ = local_98.m.m[0][1];
  auVar4._0_4_ = local_98.m.m[0][0];
  auVar4._8_4_ = local_98.m.m[0][2];
  auVar4._12_4_ = local_98.m.m[0][3];
  auVar9._8_4_ = local_98.m.m[1][0];
  auVar9._0_4_ = local_98.m.m[0][2];
  auVar9._4_4_ = local_98.m.m[0][3];
  auVar9._12_4_ = local_98.m.m[1][1];
  auVar1 = vinsertps_avx(auVar6,ZEXT416((uint)local_98.m.m[1][1]),0x10);
  auVar2 = vinsertps_avx(auVar4,ZEXT416((uint)local_98.m.m[1][0]),0x10);
  auVar17._0_4_ = auVar1._0_4_ * 0.0;
  auVar17._4_4_ = auVar1._4_4_ * 0.0;
  auVar17._8_4_ = auVar1._8_4_ * 0.0;
  auVar17._12_4_ = auVar1._12_4_ * 0.0;
  auVar2 = vfmadd213ps_fma(auVar2,ZEXT816(0) << 0x40,auVar17);
  auVar1 = vinsertps_avx(auVar9,ZEXT416((uint)local_98.m.m[1][2]),0x10);
  auVar14._0_4_ = auVar1._0_4_ + auVar2._0_4_;
  auVar14._4_4_ = auVar1._4_4_ + auVar2._4_4_;
  auVar14._8_4_ = auVar1._8_4_ + auVar2._8_4_;
  auVar14._12_4_ = auVar1._12_4_ + auVar2._12_4_;
  auVar1 = vfmadd231ss_fma(ZEXT416((uint)(local_98.m.m[2][1] * 0.0)),ZEXT816(0) << 0x20,
                           ZEXT416((uint)local_98.m.m[2][0]));
  local_b8._0_8_ = vmovlps_avx(auVar14);
  local_b8.z = auVar1._0_4_ + local_98.m.m[2][2];
  testing::internal::CmpHelperEQ<pbrt::Vector3<float>,pbrt::Vector3<float>>
            (local_c8,"to","toNew",(Vector3<float> *)&local_a8,(Vector3<float> *)&local_b8);
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d8);
    if (local_c0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = ((local_c0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/transform_test.cpp"
               ,0x5e,pcVar11);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if (local_d8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar10 = testing::internal::IsTrue(true);
      if ((bVar10) &&
         (local_d8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_d8.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(RotateFromTo, Simple) {
    {
    // Same directions...
    Vector3f from(0,0,1), to(0, 0, 1);
    Transform r = RotateFromTo(from, to);
    Vector3f toNew = r(from);
    EXPECT_EQ(to, toNew);
    }

    {
    Vector3f from(0,0,1), to(1,0,0);
    Transform r = RotateFromTo(from, to);
    Vector3f toNew = r(from);
    EXPECT_EQ(to, toNew);
    }

    {
    Vector3f from(0,0,1), to(0,1,0);
    Transform r = RotateFromTo(from, to);
    Vector3f toNew = r(from);
    EXPECT_EQ(to, toNew);
    }
}